

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.cpp
# Opt level: O3

void __thiscall
VulkanUtilities::RenderingInfoWrapper::RenderingInfoWrapper
          (RenderingInfoWrapper *this,size_t Hash,uint32_t ColorAttachmentCount,
          bool UseDepthAttachment,bool UseStencilAttachment)

{
  undefined1 auVar1 [16];
  VkRenderingAttachmentInfo *__s;
  ulong uVar2;
  undefined7 in_register_00000009;
  VkRenderingAttachmentInfo *pVVar3;
  uint uVar4;
  undefined7 in_register_00000081;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  pointer *__ptr;
  string msg;
  string local_50;
  
  uVar5 = CONCAT71(in_register_00000081,UseStencilAttachment);
  (this->m_RI).sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  *(undefined4 *)&(this->m_RI).field_0x4 = 0;
  (this->m_RI).pNext = (void *)0x0;
  (this->m_RI).flags = 0;
  (this->m_RI).renderArea.offset.x = 0;
  (this->m_RI).renderArea.offset.y = 0;
  (this->m_RI).renderArea.extent.width = 0;
  *(undefined1 (*) [16])&(this->m_RI).renderArea.extent.height = (undefined1  [16])0x0;
  (this->m_RI).pColorAttachments = (VkRenderingAttachmentInfo *)0x0;
  (this->m_RI).pDepthAttachment = (VkRenderingAttachmentInfo *)0x0;
  (this->m_RI).pStencilAttachment = (VkRenderingAttachmentInfo *)0x0;
  this->m_Hash = Hash;
  this->m_Attachments =
       (__uniq_ptr_data<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>,_true,_true>
        )0x0;
  this->m_ShadingRateAttachment =
       (__uniq_ptr_data<VkRenderingFragmentShadingRateAttachmentInfoKHR,_std::default_delete<VkRenderingFragmentShadingRateAttachmentInfoKHR>,_true,_true>
        )0x0;
  this->m_DepthAttachmentIndex = 0xffffffff;
  this->m_StencilAttachmentIndex = 0xffffffff;
  __s = (VkRenderingAttachmentInfo *)0x0;
  this->m_AttachmentClearMask = 0;
  (this->m_RI).sType = VK_STRUCTURE_TYPE_RENDERING_INFO;
  (this->m_RI).flags = 0;
  (this->m_RI).colorAttachmentCount = ColorAttachmentCount;
  uVar4 = (int)(char (*) [38])CONCAT71(in_register_00000009,UseDepthAttachment) +
          ColorAttachmentCount + (int)uVar5;
  if (uVar4 != 0) {
    uVar6 = (ulong)uVar4;
    __s = (VkRenderingAttachmentInfo *)operator_new__(uVar6 * 0x48);
    memset(__s,0,uVar6 * 0x48);
    (this->m_Attachments)._M_t.
    super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
    .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl = __s;
    auVar1 = _DAT_007f27e0;
    uVar2 = uVar6 + 3 & 0xfffffffffffffffc;
    lVar7 = uVar6 - 1;
    auVar8._8_4_ = (int)lVar7;
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar8 = auVar8 ^ _DAT_007f27e0;
    uVar5 = uVar5 & 0xffffffff;
    pVVar3 = __s;
    auVar10 = _DAT_0080cca0;
    auVar11 = _DAT_007f27d0;
    do {
      auVar12 = auVar11 ^ auVar1;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ || iVar9 < auVar12._4_4_)
                & 1)) {
        pVVar3->sType = VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_INFO;
      }
      if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
          auVar12._12_4_ <= auVar8._12_4_) {
        pVVar3[1].sType = VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_INFO;
      }
      auVar12 = auVar10 ^ auVar1;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar12._0_4_ <= auVar8._0_4_)) {
        pVVar3[2].sType = VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_INFO;
        pVVar3[3].sType = VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_INFO;
      }
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar7 + 4;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar7 + 4;
      pVVar3 = pVVar3 + 4;
      uVar2 = uVar2 - 4;
    } while (uVar2 != 0);
  }
  if (ColorAttachmentCount != 0) {
    (this->m_RI).pColorAttachments = __s;
  }
  if (UseDepthAttachment) {
    this->m_DepthAttachmentIndex = ColorAttachmentCount;
    (this->m_RI).pDepthAttachment = __s + ColorAttachmentCount;
    ColorAttachmentCount = ColorAttachmentCount + 1;
  }
  if ((char)uVar5 != '\0') {
    this->m_StencilAttachmentIndex = ColorAttachmentCount;
    (this->m_RI).pStencilAttachment = __s + ColorAttachmentCount;
    ColorAttachmentCount = ColorAttachmentCount + 1;
  }
  if (ColorAttachmentCount != uVar4) {
    Diligent::FormatString<char[26],char[38]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"AttachmentInd == TotalAttachmentCount",
               (char (*) [38])CONCAT71(in_register_00000009,UseDepthAttachment));
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"RenderingInfoWrapper",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/RenderingInfoWrapper.cpp"
               ,0x48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

RenderingInfoWrapper::RenderingInfoWrapper(size_t   Hash,
                                           uint32_t ColorAttachmentCount,
                                           bool     UseDepthAttachment,
                                           bool     UseStencilAttachment) :
    m_RI{},
    m_Hash{Hash}
{
    m_RI.sType                = VK_STRUCTURE_TYPE_RENDERING_INFO_KHR;
    m_RI.pNext                = nullptr;
    m_RI.flags                = 0;
    m_RI.colorAttachmentCount = ColorAttachmentCount;

    const uint32_t TotalAttachmentCount = ColorAttachmentCount + (UseDepthAttachment ? 1u : 0u) + (UseStencilAttachment ? 1u : 0u);
    if (TotalAttachmentCount > 0)
    {
        m_Attachments = std::make_unique<VkRenderingAttachmentInfo[]>(TotalAttachmentCount);
        for (size_t i = 0; i < TotalAttachmentCount; ++i)
            m_Attachments[i].sType = VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_INFO_KHR;
    }
    uint32_t AttachmentInd = 0;
    if (ColorAttachmentCount > 0)
    {
        m_RI.pColorAttachments = &m_Attachments[AttachmentInd];
        AttachmentInd += ColorAttachmentCount;
    }
    if (UseDepthAttachment)
    {
        m_DepthAttachmentIndex = AttachmentInd;
        m_RI.pDepthAttachment  = &m_Attachments[AttachmentInd];
        ++AttachmentInd;
    }
    if (UseStencilAttachment)
    {
        m_StencilAttachmentIndex = AttachmentInd;
        m_RI.pStencilAttachment  = &m_Attachments[AttachmentInd];
        ++AttachmentInd;
    }
    VERIFY_EXPR(AttachmentInd == TotalAttachmentCount);
}